

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::DumpNode(GeneralizedSuffixTree *this,Node *node,FILE *file)

{
  undefined8 uVar1;
  bool bVar2;
  reference ppVar3;
  reference pvVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string label_1;
  string local_68 [8];
  string label;
  Edge *edge;
  pair<const_unsigned_int,_SuffixTree::Edge> *edge_pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  *__range1;
  FILE *file_local;
  Node *node_local;
  GeneralizedSuffixTree *this_local;
  
  fprintf((FILE *)file,"p%p [shape=circle label=\"%u; %u\"]\n",node,(ulong)node->num_leaves,
          (ulong)node->num_lca);
  __end1 = std::
           unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
           ::begin(&node->edges);
  edge_pair = (pair<const_unsigned_int,_SuffixTree::Edge> *)
              std::
              unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
              ::end(&node->edges);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                         *)&edge_pair);
    if (!bVar2) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
             operator*(&__end1);
    label.field_2._8_8_ = &ppVar3->second;
    if ((ppVar3->second).length == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->strings,(ulong)(ppVar3->second).string_number);
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)pvVar4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &local_b8,"$");
      std::__cxx11::string::~string((string *)&local_b8);
      uVar1 = *(undefined8 *)label.field_2._8_8_;
      uVar5 = std::__cxx11::string::c_str();
      fprintf((FILE *)file,"p%p -> p%p [label=\"%s\"]\n",node,uVar1,uVar5);
      fprintf((FILE *)file,"p%p [style=filled color=grey shape=circle label=\"%u\"]\n",
              *(undefined8 *)label.field_2._8_8_,(ulong)*(uint *)(*(long *)label.field_2._8_8_ + 8))
      ;
      std::__cxx11::string::~string((string *)local_98);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->strings,(ulong)(ppVar3->second).string_number);
      std::__cxx11::string::substr((ulong)local_68,(ulong)pvVar4);
      uVar1 = *(undefined8 *)label.field_2._8_8_;
      uVar5 = std::__cxx11::string::c_str();
      fprintf((FILE *)file,"p%p -> p%p [label=\"%s\"]\n",node,uVar1,uVar5);
      DumpNode(this,*(Node **)label.field_2._8_8_,file);
      std::__cxx11::string::~string(local_68);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::DumpNode (Node *node, FILE *file)
{
    // dump style of current node
    fprintf (file, "p%p [shape=circle label=\"%u; %u\"]\n",
             static_cast<void *> (node), node->num_leaves, node->num_lca);
    // process all child of current node
    for (const auto &edge_pair : node->edges)
    {
        const Edge &edge = edge_pair.second;
        if (edge.length)
        {
            // child is node
            std::string label = strings[edge.string_number].substr (edge.start, edge.length);
            fprintf (file, "p%p -> p%p [label=\"%s\"]\n",
                     static_cast<void *> (node), static_cast<void *> (edge.node), label.c_str());
            DumpNode (edge.node, file);
        }
        else
        {
            // child is leaf
            std::string label = strings[edge.string_number].substr (edge.start) + "$";
            fprintf (file, "p%p -> p%p [label=\"%s\"]\n",
                     static_cast<void *> (node), static_cast<void *> (edge.leaf), label.c_str());
            fprintf (file, "p%p [style=filled color=grey shape=circle label=\"%u\"]\n",
                     static_cast<void *> (edge.leaf), edge.leaf->string_number);
        }
    }
}